

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5WriteAppendTerm(Fts5Index *p,Fts5SegWriter *pWriter,int nTerm,u8 *pTerm)

{
  Fts5Buffer *pBuf;
  Fts5Buffer *pBuf_00;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  u32 nData;
  ulong uVar5;
  int *piVar6;
  
  uVar3 = (pWriter->writer).term.n;
  uVar5 = (ulong)uVar3;
  if (nTerm <= (int)uVar3) {
    uVar5 = (ulong)(uint)nTerm;
  }
  iVar4 = (int)uVar5;
  pBuf = &(pWriter->writer).buf;
  iVar1 = (pWriter->writer).buf.n;
  if (p->pConfig->pgsz <= (pWriter->writer).pgidx.n + nTerm + iVar1 + 2) {
    if ((4 < iVar1) && (fts5WriteFlushLeaf(p,pWriter), p->rc != 0)) {
      return;
    }
    uVar3 = nTerm + (pWriter->writer).buf.n + 0x14;
    if ((uint)(pWriter->writer).buf.nSpace < uVar3) {
      sqlite3Fts5BufferSize(&p->rc,pBuf,uVar3);
    }
  }
  pBuf_00 = &(pWriter->writer).term;
  iVar1 = sqlite3Fts5PutVarint
                    ((pWriter->writer).pgidx.p + (pWriter->writer).pgidx.n,
                     (long)(pWriter->writer).buf.n - (long)(pWriter->writer).iPrevPgidx);
  piVar6 = &(pWriter->writer).pgidx.n;
  *piVar6 = *piVar6 + iVar1;
  (pWriter->writer).iPrevPgidx = (pWriter->writer).buf.n;
  if (pWriter->bFirstTermInPage == '\0') {
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    else {
      uVar2 = 0;
      do {
        if (pBuf_00->p[uVar2] != pTerm[uVar2]) {
          iVar4 = (int)uVar2;
          break;
        }
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    sqlite3Fts5BufferAppendVarint(&p->rc,pBuf,(long)iVar4);
    iVar1 = iVar4;
  }
  else {
    iVar1 = 0;
    if ((pWriter->writer).pgno != 1) {
      nData = nTerm;
      if ((pWriter->writer).term.n != 0) {
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        else {
          uVar2 = 0;
          do {
            if (pBuf_00->p[uVar2] != pTerm[uVar2]) {
              iVar4 = (int)uVar2;
              break;
            }
            uVar2 = uVar2 + 1;
          } while (uVar5 != uVar2);
        }
        nData = iVar4 + 1;
      }
      fts5WriteFlushBtree(p,pWriter);
      if (p->rc == 0) {
        (pWriter->btterm).n = 0;
        sqlite3Fts5BufferAppendBlob(&p->rc,&pWriter->btterm,nData,pTerm);
        pWriter->iBtPage = (pWriter->writer).pgno;
      }
      if (p->rc != 0) {
        return;
      }
    }
  }
  piVar6 = &p->rc;
  sqlite3Fts5BufferAppendVarint(piVar6,pBuf,(long)nTerm - (long)iVar1);
  sqlite3Fts5BufferAppendBlob(piVar6,pBuf,nTerm - iVar1,pTerm + iVar1);
  (pWriter->writer).term.n = 0;
  sqlite3Fts5BufferAppendBlob(piVar6,pBuf_00,nTerm,pTerm);
  pWriter->bFirstTermInPage = '\0';
  pWriter->bFirstRowidInDoclist = '\x01';
  pWriter->bFirstRowidInPage = '\0';
  pWriter->aDlidx->pgno = (pWriter->writer).pgno;
  return;
}

Assistant:

static void fts5WriteAppendTerm(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  int nTerm, const u8 *pTerm
){
  int nPrefix;                    /* Bytes of prefix compression for term */
  Fts5PageWriter *pPage = &pWriter->writer;
  Fts5Buffer *pPgidx = &pWriter->writer.pgidx;
  int nMin = MIN(pPage->term.n, nTerm);

  assert( p->rc==SQLITE_OK );
  assert( pPage->buf.n>=4 );
  assert( pPage->buf.n>4 || pWriter->bFirstTermInPage );

  /* If the current leaf page is full, flush it to disk. */
  if( (pPage->buf.n + pPgidx->n + nTerm + 2)>=p->pConfig->pgsz ){
    if( pPage->buf.n>4 ){
      fts5WriteFlushLeaf(p, pWriter);
      if( p->rc!=SQLITE_OK ) return;
    }
    fts5BufferGrow(&p->rc, &pPage->buf, nTerm+FTS5_DATA_PADDING);
  }

  /* TODO1: Updating pgidx here. */
  pPgidx->n += sqlite3Fts5PutVarint(
      &pPgidx->p[pPgidx->n], pPage->buf.n - pPage->iPrevPgidx
  );
  pPage->iPrevPgidx = pPage->buf.n;
#if 0
  fts5PutU16(&pPgidx->p[pPgidx->n], pPage->buf.n);
  pPgidx->n += 2;
#endif

  if( pWriter->bFirstTermInPage ){
    nPrefix = 0;
    if( pPage->pgno!=1 ){
      /* This is the first term on a leaf that is not the leftmost leaf in
      ** the segment b-tree. In this case it is necessary to add a term to
      ** the b-tree hierarchy that is (a) larger than the largest term
      ** already written to the segment and (b) smaller than or equal to
      ** this term. In other words, a prefix of (pTerm/nTerm) that is one
      ** byte longer than the longest prefix (pTerm/nTerm) shares with the
      ** previous term.
      **
      ** Usually, the previous term is available in pPage->term. The exception
      ** is if this is the first term written in an incremental-merge step.
      ** In this case the previous term is not available, so just write a
      ** copy of (pTerm/nTerm) into the parent node. This is slightly
      ** inefficient, but still correct.  */
      int n = nTerm;
      if( pPage->term.n ){
        n = 1 + fts5PrefixCompress(nMin, pPage->term.p, pTerm);
      }
      fts5WriteBtreeTerm(p, pWriter, n, pTerm);
      if( p->rc!=SQLITE_OK ) return;
      pPage = &pWriter->writer;
    }
  }else{
    nPrefix = fts5PrefixCompress(nMin, pPage->term.p, pTerm);
    fts5BufferAppendVarint(&p->rc, &pPage->buf, nPrefix);
  }

  /* Append the number of bytes of new data, then the term data itself
  ** to the page. */
  fts5BufferAppendVarint(&p->rc, &pPage->buf, nTerm - nPrefix);
  fts5BufferAppendBlob(&p->rc, &pPage->buf, nTerm - nPrefix, &pTerm[nPrefix]);

  /* Update the Fts5PageWriter.term field. */
  fts5BufferSet(&p->rc, &pPage->term, nTerm, pTerm);
  pWriter->bFirstTermInPage = 0;

  pWriter->bFirstRowidInPage = 0;
  pWriter->bFirstRowidInDoclist = 1;

  assert( p->rc || (pWriter->nDlidx>0 && pWriter->aDlidx[0].buf.n==0) );
  pWriter->aDlidx[0].pgno = pPage->pgno;
}